

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

HANDLE init_std_handle(HANDLE *pStd,FILE *stream)

{
  int iVar1;
  int iVar2;
  CPalThread *pCVar3;
  int *piVar4;
  bool bVar5;
  undefined8 uStack_68;
  CObjectAttributes oa;
  IPalObject *pRegisteredFile;
  CFileProcessLocalData *pLocalData;
  HANDLE hFile;
  IDataLock *pDataLock;
  IPalObject *pFileObject;
  
  pCVar3 = CorUnix::InternalGetCurrentThread();
  pDataLock = (IDataLock *)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  hFile = (HANDLE)0x0;
  pRegisteredFile = (IPalObject *)0x0;
  uStack_68 = 0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName.m_dwStringLength = 0;
  oa.sObjectName.m_dwMaxLength = 0;
  pLocalData = (CFileProcessLocalData *)0xffffffffffffffff;
  iVar1 = fileno((FILE *)stream);
  iVar1 = dup(iVar1);
  if (iVar1 == -1) {
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    piVar4 = __errno_location();
    strerror(*piVar4);
    bVar5 = true;
  }
  else {
    iVar2 = (**(code **)*CorUnix::g_pObjectManager)
                      (CorUnix::g_pObjectManager,pCVar3,&CorUnix::otFile,&uStack_68,&pDataLock);
    if (iVar2 == 0) {
      iVar2 = (*pDataLock->_vptr_IDataLock[3])(pDataLock,pCVar3,1,&hFile,&pRegisteredFile);
      if (iVar2 == 0) {
        *(undefined4 *)&pRegisteredFile[0x203]._vptr_IPalObject = 1;
        *(int *)&pRegisteredFile[1]._vptr_IPalObject = iVar1;
        *(undefined8 *)((long)&pRegisteredFile[1]._vptr_IPalObject + 4) = 0;
        *(undefined4 *)((long)&pRegisteredFile[2]._vptr_IPalObject + 4) = 0;
        pRegisteredFile->_vptr_IPalObject = (_func_int **)0x0;
        (*(code *)**hFile)(hFile,pCVar3,1);
        hFile = (HANDLE)0x0;
        iVar2 = (**(code **)(*CorUnix::g_pObjectManager + 8))
                          (CorUnix::g_pObjectManager,pCVar3,pDataLock,CorUnix::aotFile,0,&pLocalData
                           ,&oa.pSecurityAttributes);
        pDataLock = (IDataLock *)0x0;
        bVar5 = iVar2 == 0;
        goto LAB_00322cf3;
      }
    }
    bVar5 = false;
  }
LAB_00322cf3:
  if (hFile != (HANDLE)0x0) {
    (*(code *)**hFile)(hFile,pCVar3,1);
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,pCVar3);
  }
  if (oa.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)oa.pSecurityAttributes + 0x40))(oa.pSecurityAttributes,pCVar3);
  }
  if (bVar5) {
    *pStd = pLocalData;
  }
  else if (iVar1 != -1) {
    close(iVar1);
  }
  return pLocalData;
}

Assistant:

static HANDLE init_std_handle(HANDLE * pStd, FILE *stream)
{
    CPalThread *pThread = InternalGetCurrentThread();
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    IPalObject *pRegisteredFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IFileLockController *pLockController = NULL;
    CObjectAttributes oa;

    HANDLE hFile = INVALID_HANDLE_VALUE;
    int new_fd = -1;

    /* duplicate the FILE *, so that we can fclose() in FILECloseHandle without
       closing the original */
    new_fd = dup(fileno(stream));
    if(-1 == new_fd)
    {
        ERROR("dup() failed; errno is %d (%s)\n", errno, strerror(errno));
        goto done;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oa,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    pLocalData->inheritable = TRUE;
    pLocalData->unix_fd = new_fd;
    pLocalData->dwDesiredAccess = 0;
    pLocalData->open_flags = 0;
    pLocalData->open_flags_deviceaccessonly = FALSE;

    //
    // Transfer the lock controller reference from our local variable
    // to the local file data
    //

    pLocalData->pLockController = pLockController;
    pLockController = NULL;

    //
    // We've finished initializing our local data, so release that lock
    //

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pFileObject,
        &aotFile, 
        0,
        &hFile,
        &pRegisteredFile
        );

    //
    // pFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pFileObject = NULL;

done:

    if (NULL != pLockController)
    {
        pLockController->ReleaseController();
    }

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, TRUE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (NULL != pRegisteredFile)
    {
        pRegisteredFile->ReleaseReference(pThread);
    }

    if (NO_ERROR == palError)
    {
        *pStd = hFile;
    }
    else if (-1 != new_fd)
    {
        close(new_fd);
    }

    return hFile;
}